

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O3

int __thiscall ON_PointCloud::RemoveRange(ON_PointCloud *this,int count,int *pIndices)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar5;
  ON_3dPoint *pOVar6;
  double dVar7;
  ON_3dVector *pOVar8;
  ON_Color *pOVar9;
  double *pdVar10;
  bool *pbVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  uint uVar15;
  uint uVar16;
  uint i;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ON_3dPoint t;
  ON_SimpleArray<int> indices;
  ON_SimpleArray<int> local_48;
  
  iVar19 = 0;
  if (((pIndices != (int *)0x0) && (iVar19 = 0, 0 < count)) &&
     (uVar20 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count, uVar20 != 0)) {
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
    local_48.m_a = (int *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    ON_SimpleArray<int>::SetCapacity(&local_48,(ulong)(uint)count);
    ON_SimpleArray<int>::Append(&local_48,count,pIndices);
    ON_SimpleArray<int>::QuickSortAndRemoveDuplicates(&local_48,ON_CompareDecreasing<int>);
    if ((local_48._16_8_ & 0xffffffff) == 0) {
      iVar19 = 0;
    }
    else {
      uVar16 = (this->m_N).m_count;
      uVar2 = (this->m_C).m_count;
      uVar3 = (this->m_V).m_count;
      uVar4 = (this->m_H).m_count;
      uVar17 = 0;
      iVar19 = 0;
      uVar21 = uVar20;
      do {
        uVar15 = local_48.m_a[uVar17];
        if (uVar15 < uVar20) {
          uVar21 = uVar21 - 1;
          if (uVar15 != uVar21) {
            pOVar6 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
            dVar7 = pOVar6[(int)uVar15].z;
            dVar12 = pOVar6[(int)uVar15].x;
            dVar13 = pOVar6[(int)uVar15].y;
            dVar14 = pOVar6[(int)uVar21].y;
            pOVar6[(int)uVar15].x = pOVar6[(int)uVar21].x;
            pOVar6[(int)uVar15].y = dVar14;
            pOVar6[(int)uVar15].z = pOVar6[(int)uVar21].z;
            pOVar6 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
            pOVar6[(int)uVar21].z = dVar7;
            pOVar6 = pOVar6 + (int)uVar21;
            pOVar6->x = dVar12;
            pOVar6->y = dVar13;
            if (uVar20 == uVar16) {
              pOVar8 = (this->m_N).m_a;
              dVar7 = pOVar8[(int)uVar15].z;
              dVar12 = pOVar8[(int)uVar15].x;
              dVar13 = pOVar8[(int)uVar15].y;
              dVar14 = pOVar8[(int)uVar21].y;
              pOVar8[(int)uVar15].x = pOVar8[(int)uVar21].x;
              pOVar8[(int)uVar15].y = dVar14;
              pOVar8[(int)uVar15].z = pOVar8[(int)uVar21].z;
              pOVar8 = (this->m_N).m_a;
              pOVar8[(int)uVar21].z = dVar7;
              pOVar8 = pOVar8 + (int)uVar21;
              pOVar8->x = dVar12;
              pOVar8->y = dVar13;
            }
            if (uVar20 == uVar2) {
              if (uVar15 == uVar21) goto LAB_0058332f;
              pOVar9 = (this->m_C).m_a;
              aVar5 = pOVar9[(int)uVar15].field_0;
              pOVar9[(int)uVar15].field_0 = pOVar9[(int)uVar21].field_0;
              (this->m_C).m_a[(int)uVar21].field_0 = aVar5;
              if (uVar20 == uVar3) goto LAB_005832f0;
            }
            else if ((uVar20 == uVar3) && (uVar15 != uVar21)) {
LAB_005832f0:
              pdVar10 = (this->m_V).m_a;
              dVar7 = pdVar10[(int)uVar15];
              pdVar10[(int)uVar15] = pdVar10[(int)uVar21];
              pdVar10[(int)uVar21] = dVar7;
            }
            if ((uVar20 == uVar4) && (uVar15 != uVar21)) {
              pbVar11 = (this->m_H).m_a;
              bVar1 = pbVar11[(int)uVar15];
              pbVar11[(int)uVar15] = pbVar11[(int)uVar21];
              pbVar11[(int)uVar21] = bVar1;
            }
          }
LAB_0058332f:
          iVar19 = iVar19 + 1;
          if (uVar21 == 0) {
            uVar21 = 0;
            break;
          }
        }
        uVar17 = uVar17 + 1;
      } while ((local_48._16_8_ & 0xffffffff) != uVar17);
      if (((int)uVar21 < 0) ||
         ((this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_capacity < (int)uVar21)) {
        uVar15 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count;
      }
      else {
        (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar21;
        uVar15 = uVar21;
      }
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,(long)(int)uVar15);
      if (uVar20 == uVar16) {
        if (((int)uVar21 < 0) || ((this->m_N).m_capacity < (int)uVar21)) {
          uVar16 = (this->m_N).m_count;
        }
        else {
          (this->m_N).m_count = uVar21;
          uVar16 = uVar21;
        }
        ON_SimpleArray<ON_3dVector>::SetCapacity(&this->m_N,(long)(int)uVar16);
      }
      if (uVar20 == uVar2) {
        if (((int)uVar21 < 0) || ((this->m_C).m_capacity < (int)uVar21)) {
          uVar16 = (this->m_C).m_count;
        }
        else {
          (this->m_C).m_count = uVar21;
          uVar16 = uVar21;
        }
        ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,(long)(int)uVar16);
      }
      if (uVar20 == uVar3) {
        if (((int)uVar21 < 0) || ((this->m_V).m_capacity < (int)uVar21)) {
          uVar16 = (this->m_V).m_count;
        }
        else {
          (this->m_V).m_count = uVar21;
          uVar16 = uVar21;
        }
        ON_SimpleArray<double>::SetCapacity(&this->m_V,(long)(int)uVar16);
      }
      if (uVar20 == uVar4) {
        if (((int)uVar21 < 0) || ((this->m_H).m_capacity < (int)uVar21)) {
          uVar21 = (this->m_H).m_count;
        }
        else {
          (this->m_H).m_count = uVar21;
        }
        ON_SimpleArray<bool>::SetCapacity(&this->m_H,(long)(int)uVar21);
        this->m_hidden_count = 0;
        uVar17 = (ulong)(uint)(this->m_H).m_count;
        if (uVar17 != 0) {
          pbVar11 = (this->m_H).m_a;
          uVar18 = 0;
          uVar20 = 0;
          do {
            if (pbVar11[uVar18] == true) {
              uVar20 = uVar20 + 1;
              this->m_hidden_count = uVar20;
            }
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        ON_BoundingBox::Destroy(&this->m_bbox);
      }
    }
    ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
  }
  return iVar19;
}

Assistant:

int ON_PointCloud::RemoveRange(int count, const int* pIndices)
{
  const unsigned int point_count = m_P.UnsignedCount();
  if (0 == point_count || count <= 0 || nullptr == pIndices)
    return 0;

  ON_SimpleArray<int> indices(count);
  indices.Append(count, pIndices);
  indices.QuickSortAndRemoveDuplicates(ON_CompareDecreasing<int>);

  const unsigned int index_count = indices.Count();
  if (index_count <= 0)
    return 0;

  const bool bHaveNormals = point_count == m_N.UnsignedCount();
  const bool bHaveColors = point_count == m_C.UnsignedCount();
  const bool bHaveValues = point_count == m_V.UnsignedCount();
  const bool bHaveHidden = point_count == m_H.UnsignedCount();

  unsigned int points_removed = 0;
  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < index_count; i++)
  {
    const unsigned int point_index = indices[i];
    if (point_index >= 0 && point_index < point_count)
    {
      m_P.Swap(point_index, last_point_count - 1);
      if (bHaveNormals)
        m_N.Swap(point_index, last_point_count - 1);
      if (bHaveColors)
        m_C.Swap(point_index, last_point_count - 1);
      if (bHaveValues)
        m_V.Swap(point_index, last_point_count - 1);
      if (bHaveHidden)
        m_H.Swap(point_index, last_point_count - 1);

      points_removed++;
      last_point_count--;
      if (last_point_count <= 0)
        break;
    }
  }

  m_P.SetCount(last_point_count);
  m_P.Shrink();
  if (bHaveNormals)
  {
    m_N.SetCount(last_point_count);
    m_N.Shrink();
  }
  if (bHaveColors)
  {
    m_C.SetCount(last_point_count);
    m_C.Shrink();
  }
  if (bHaveValues)
  {
    m_V.SetCount(last_point_count);
    m_V.Shrink();
  }
  if (bHaveHidden)
  {
    m_H.SetCount(last_point_count);
    m_H.Shrink();
    m_hidden_count = 0;
    for (unsigned int i = 0; i < m_H.UnsignedCount(); i++)
    {
      if (m_H[i])
        m_hidden_count++;
    }
    InvalidateBoundingBox();
  }

  return points_removed;
}